

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::HasExtension(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor_00;
  int local_1c;
  int i;
  Descriptor *descriptor_local;
  
  iVar2 = Descriptor::extension_count(descriptor);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = Descriptor::nested_type_count(descriptor), local_1c < iVar2;
        local_1c = local_1c + 1) {
      descriptor_00 = Descriptor::nested_type(descriptor,local_1c);
      bVar1 = HasExtension(descriptor_00);
      if (bVar1) {
        return true;
      }
    }
    descriptor_local._7_1_ = false;
  }
  else {
    descriptor_local._7_1_ = true;
  }
  return descriptor_local._7_1_;
}

Assistant:

bool HasExtension(const Descriptor* descriptor) {
  if (descriptor->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasExtension(descriptor->nested_type(i))) {
      return true;
    }
  }
  return false;
}